

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::walk
          (Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_> *this,Expression **root)

{
  size_t sVar1;
  pointer pTVar2;
  pointer pTVar3;
  TaskFunc_conflict p_Var4;
  Expression **ppEVar5;
  
  if (((long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task,_std::allocator<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->stack).flexible.
             super__Vector_base<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task,_std::allocator<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) + (this->stack).usedFixed != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<LocalizerPass, wasm::Visitor<LocalizerPass>>::walk(Expression *&) [SubType = LocalizerPass, VisitorType = wasm::Visitor<LocalizerPass>]"
                 );
  }
  pushTask(this,PostWalker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::scan,root);
  while( true ) {
    sVar1 = (this->stack).usedFixed;
    pTVar2 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task,_std::allocator<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (this->stack).flexible.
             super__Vector_base<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task,_std::allocator<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((long)pTVar3 - (long)pTVar2 >> 4) + sVar1 == 0) {
      return;
    }
    if (pTVar2 == pTVar3) {
      if (sVar1 == 0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                      ,0x7e,
                      "T &wasm::SmallVector<wasm::Walker<LocalizerPass, wasm::Visitor<LocalizerPass>>::Task, 10>::back() [T = wasm::Walker<LocalizerPass, wasm::Visitor<LocalizerPass>>::Task, N = 10]"
                     );
      }
      p_Var4 = (this->stack).fixed._M_elems[sVar1 - 1].func;
      ppEVar5 = (this->stack).fixed._M_elems[sVar1 - 1].currp;
      (this->stack).usedFixed = sVar1 - 1;
    }
    else {
      p_Var4 = (TaskFunc_conflict)pTVar3[-1].func;
      ppEVar5 = pTVar3[-1].currp;
      (this->stack).flexible.
      super__Vector_base<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task,_std::allocator<wasm::Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar3 + -1;
    }
    this->replacep = ppEVar5;
    if (*ppEVar5 == (Expression *)0x0) break;
    (*p_Var4)((LocalizerPass *)(this[-1].stack.fixed._M_elems + 7),ppEVar5);
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x132,
                "void wasm::Walker<LocalizerPass, wasm::Visitor<LocalizerPass>>::walk(Expression *&) [SubType = LocalizerPass, VisitorType = wasm::Visitor<LocalizerPass>]"
               );
}

Assistant:

void walk(Expression*& root) {
    assert(stack.size() == 0);
    pushTask(SubType::scan, &root);
    while (stack.size() > 0) {
      auto task = popTask();
      replacep = task.currp;
      assert(*task.currp);
      task.func(static_cast<SubType*>(this), task.currp);
    }
  }